

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-agg.cpp
# Opt level: O1

void __thiscall RasterizerAGG::RasterizerAGG(RasterizerAGG *this,Image *dst,uint32_t options)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  rbuf_type *prVar5;
  int i;
  long lVar6;
  
  Rasterizer::Rasterizer(&this->super_Rasterizer,dst,options);
  (this->super_Rasterizer)._vptr_Rasterizer = (_func_int **)&PTR__RasterizerAGG_00130d78;
  puVar4 = dst->_data;
  uVar1 = dst->_width;
  uVar2 = dst->_height;
  iVar3 = (int)dst->_stride;
  *(undefined8 *)((long)&(this->_rbuf).m_start + 4) = 0;
  (this->_rbuf).m_height = 0;
  (this->_rbuf).m_stride = 0;
  (this->_rbuf).m_buf = (uchar *)0x0;
  (this->_rbuf).m_start = (uchar *)0x0;
  (this->_rbuf).m_start = puVar4;
  (this->_rbuf).m_buf = puVar4;
  (this->_rbuf).m_width = uVar1;
  (this->_rbuf).m_height = uVar2;
  (this->_rbuf).m_stride = iVar3;
  if (iVar3 < 0) {
    (this->_rbuf).m_start = puVar4 + -(long)(int)((uVar2 - 1) * iVar3);
  }
  (this->_pixfmt).m_rbuf = &this->_rbuf;
  (this->_baseRenderer).m_ren = &this->_pixfmt;
  (this->_baseRenderer).m_clip_box.x1 = 0;
  (this->_baseRenderer).m_clip_box.y1 = 0;
  (this->_baseRenderer).m_clip_box.x2 = uVar1 - 1;
  (this->_baseRenderer).m_clip_box.y2 = uVar2 - 1;
  (this->_solidRenderer).m_ren = &this->_baseRenderer;
  agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::rasterizer_scanline_aa
            (&this->_rasterizer);
  (this->_scanline).m_last_x = 0x7ffffff0;
  lVar6 = 0;
  (this->_scanline).m_covers.m_array = (uchar *)0x0;
  (this->_scanline).m_covers.m_size = 0;
  (this->_scanline).m_cur_span = (span *)0x0;
  (this->_scanline).m_cover_ptr = (cover_type *)0x0;
  (this->_scanline).m_spans.m_array = (span *)0x0;
  (this->_scanline).m_spans.m_size = 0;
  builtin_strncpy((this->super_Rasterizer)._name,"AGG",4);
  Rasterizer::addOptionsToName(&this->super_Rasterizer);
  do {
    (this->_rasterizer).m_gamma[lVar6] = (int)(long)(((double)(int)lVar6 / 255.0) * 255.0 + 0.5);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::clip_box
            (&this->_rasterizer,0.0,0.0,(double)dst->_width,(double)dst->_height);
  (this->_baseRenderer).m_clip_box.x1 = 0;
  (this->_baseRenderer).m_clip_box.y1 = 0;
  prVar5 = ((this->_baseRenderer).m_ren)->m_rbuf;
  (this->_baseRenderer).m_clip_box.x2 = prVar5->m_width - 1;
  (this->_baseRenderer).m_clip_box.y2 = prVar5->m_height - 1;
  return;
}

Assistant:

RasterizerAGG::RasterizerAGG(Image& dst, uint32_t options) noexcept
  : Rasterizer(dst, options),
    _rbuf(reinterpret_cast<unsigned char*>(dst.data()), dst.width(), dst.height(), int(dst.stride())),
    _pixfmt(_rbuf),
    _baseRenderer(_pixfmt),
    _solidRenderer(_baseRenderer) {
  std::snprintf(_name, ARRAY_SIZE(_name), "AGG");
  addOptionsToName();

  _rasterizer.gamma(agg::gamma_none());
  _rasterizer.clip_box(0, 0, dst.width(), dst.height());
  _baseRenderer.reset_clipping(true);
}